

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dump2XYZ.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  void *pvVar4;
  RigidBody *this;
  char *pcVar5;
  SnapshotManager *this_00;
  int i;
  Snapshot *currentSnapshot;
  Mat3x3d hmat;
  Vector3d displacement;
  Vector3d newMolCom;
  Vector3d molCom;
  RigidBody *rb;
  StuntDouble *sd;
  Molecule *mol;
  RigidBodyIterator rbIter;
  IntegrableObjectIterator iiter;
  MoleculeIterator miter;
  ofstream xyzStream;
  int nframes;
  DumpReader *dumpReader;
  PrepareVisitor *prepareVisitor;
  XYZVisitor *xyzVisitor;
  ReplicateVisitor *replicateVisitor;
  Vector3i replicateOpt;
  ZConsVisitor *zconsVisitor;
  AtomNameVisitor *atomNameVisitor;
  WaterTypeVisitor *waterTypeVisitor;
  DefaultAtomVisitor *defaultAtomVisitor;
  GBheadVisitor *gbhVisitor;
  GBtailVisitor *gbtVisitor;
  SSDAtomVisitor *ssdVisitor;
  RBCOMVisitor *rbCOMVisitor;
  CompositeVisitor *compositeVisitor;
  ForceManager *forceMan;
  SimInfo *info;
  SimCreator creator;
  bool printGlobalID;
  bool printField;
  bool printChrg;
  bool printVec;
  bool printFrc;
  bool printVel;
  string xyzFileName;
  string dumpFileName;
  gengetopt_args_info args_info;
  undefined1 in_stack_00010107;
  string *in_stack_00010108;
  SimCreator *in_stack_00010110;
  Vector<double,_3U> *in_stack_fffffffffffff6d8;
  DumpReader *in_stack_fffffffffffff6e0;
  SimInfo *in_stack_fffffffffffff6e8;
  StuntDouble *in_stack_fffffffffffff6f0;
  SimInfo *in_stack_fffffffffffff6f8;
  SimInfo *in_stack_fffffffffffff700;
  allocator<char> *in_stack_fffffffffffff710;
  char *in_stack_fffffffffffff718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff720;
  string *in_stack_fffffffffffff730;
  SimInfo *in_stack_fffffffffffff738;
  XYZVisitor *in_stack_fffffffffffff740;
  Vector3i *in_stack_fffffffffffff750;
  SimInfo *in_stack_fffffffffffff758;
  Snapshot *in_stack_fffffffffffff760;
  SimInfo *in_stack_fffffffffffff768;
  DumpReader *in_stack_fffffffffffff770;
  BaseVisitor *in_stack_fffffffffffff778;
  CompositeVisitor *in_stack_fffffffffffff780;
  SimInfo *in_stack_fffffffffffff788;
  ForceManager *in_stack_fffffffffffff790;
  string *in_stack_fffffffffffff7a8;
  string *in_stack_fffffffffffff7b0;
  SimInfo *in_stack_fffffffffffff7b8;
  LipidTransVisitor *in_stack_fffffffffffff7c0;
  SimInfo *in_stack_fffffffffffff7f8;
  GBheadVisitor *in_stack_fffffffffffff800;
  SimInfo *in_stack_fffffffffffff8f8;
  ZConsVisitor *in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff934;
  int iVar6;
  SimInfo *in_stack_fffffffffffff938;
  DumpReader *in_stack_fffffffffffff940;
  SimInfo *in_stack_fffffffffffff9a8;
  SSDAtomVisitor *in_stack_fffffffffffff9b0;
  SimInfo *local_630;
  DumpReader *local_628;
  Snapshot *local_620;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  local_618;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_610;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_608;
  RigidBody *in_stack_fffffffffffffa00;
  undefined6 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1e;
  allocator<char> in_stack_fffffffffffffc1f;
  XYZVisitor *in_stack_fffffffffffffc20;
  XYZVisitor *local_3c0;
  allocator<char> local_3b1;
  string local_3b0 [39];
  allocator<char> local_389;
  string local_388 [48];
  void *local_358;
  long *local_340;
  void *local_338;
  void *local_330;
  void *local_328;
  void *local_320;
  void *local_318;
  RigidBody *local_310;
  void *local_308;
  long *local_300;
  long *local_2f8;
  SimInfo *local_2f0;
  string local_2c0 [32];
  string local_2a0 [50];
  undefined1 local_26e;
  undefined1 local_26d;
  undefined1 local_26c;
  undefined1 local_26b;
  byte local_26a;
  byte local_269;
  string local_268 [32];
  string local_248 [48];
  char *local_218;
  char *local_200;
  int local_1e8;
  int local_1c0;
  int local_1b0;
  int local_1a0;
  int local_190;
  int local_f0;
  int local_e0;
  int local_d0;
  int local_c0;
  int local_b0;
  int local_a0;
  int local_90;
  int local_78;
  int local_74;
  int local_6c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_4;
  
  local_4 = 0;
  std::__cxx11::string::string(local_248);
  std::__cxx11::string::string(local_268);
  local_269 = 0;
  local_26a = 0;
  local_26b = 0;
  local_26c = 0;
  local_26d = 0;
  local_26e = 0;
  iVar2 = cmdline_parser((int)((ulong)in_stack_fffffffffffff6e0 >> 0x20),
                         (char **)in_stack_fffffffffffff6d8,(gengetopt_args_info *)0x126da7);
  if (iVar2 == 0) {
    if (local_78 == 0) {
      strcpy(painCave.errMsg,"No input file name was specified.\n");
      painCave.isFatal = 1;
      simError();
    }
    else {
      std::__cxx11::string::operator=(local_248,local_218);
    }
    if (local_74 == 0) {
      std::__cxx11::string::operator=(local_268,local_248);
      std::__cxx11::string::rfind((char *)local_268,0x3bd998);
      std::__cxx11::string::substr((ulong)local_2c0,(ulong)local_268);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff6e8,(char *)in_stack_fffffffffffff6e0);
      std::__cxx11::string::operator=(local_268,local_2a0);
      std::__cxx11::string::~string(local_2a0);
      std::__cxx11::string::~string(local_2c0);
    }
    else {
      std::__cxx11::string::operator=(local_268,local_200);
    }
    OpenMD::SimCreator::SimCreator((SimCreator *)0x126f47);
    local_2f0 = OpenMD::SimCreator::createSim
                          (in_stack_00010110,in_stack_00010108,(bool)in_stack_00010107);
    plVar3 = (long *)operator_new(0xc80);
    OpenMD::ForceManager::ForceManager(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
    local_2f8 = plVar3;
    plVar3 = (long *)operator_new(0x40);
    OpenMD::CompositeVisitor::CompositeVisitor((CompositeVisitor *)in_stack_fffffffffffff6f0);
    local_300 = plVar3;
    if (local_1a0 != 0) {
      pvVar4 = operator_new(0x30);
      OpenMD::RBCOMVisitor::RBCOMVisitor
                ((RBCOMVisitor *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
      local_308 = pvVar4;
      OpenMD::CompositeVisitor::addVisitor
                (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
                 (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
    }
    this = (RigidBody *)operator_new(0x78);
    OpenMD::SSDAtomVisitor::SSDAtomVisitor(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    local_310 = this;
    OpenMD::CompositeVisitor::addVisitor
              (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
               (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
    pvVar4 = operator_new(0x78);
    OpenMD::GBtailVisitor::GBtailVisitor
              ((GBtailVisitor *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
    local_318 = pvVar4;
    OpenMD::CompositeVisitor::addVisitor
              (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
               (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
    pvVar4 = operator_new(0x78);
    OpenMD::GBheadVisitor::GBheadVisitor(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
    local_320 = pvVar4;
    OpenMD::CompositeVisitor::addVisitor
              (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
               (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
    pvVar4 = operator_new(0x38);
    OpenMD::DefaultAtomVisitor::DefaultAtomVisitor
              ((DefaultAtomVisitor *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
    local_328 = pvVar4;
    OpenMD::CompositeVisitor::addVisitor
              (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
               (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
    if ((local_6c == 0) && (local_190 != 0)) {
      pvVar4 = operator_new(0x58);
      OpenMD::WaterTypeVisitor::WaterTypeVisitor((WaterTypeVisitor *)in_stack_fffffffffffffc20);
      local_330 = pvVar4;
      OpenMD::CompositeVisitor::addVisitor
                (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
                 (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
    }
    if (local_f0 != 0) {
      pvVar4 = operator_new(0x38);
      OpenMD::AtomNameVisitor::AtomNameVisitor
                ((AtomNameVisitor *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
      local_338 = pvVar4;
      OpenMD::CompositeVisitor::addVisitor
                (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
                 (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
    }
    if (local_1b0 != 0) {
      plVar3 = (long *)operator_new(0xe8);
      OpenMD::ZConsVisitor::ZConsVisitor(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
      local_340 = plVar3;
      bVar1 = OpenMD::ZConsVisitor::haveZconsMol((ZConsVisitor *)0x127477);
      if (bVar1) {
        OpenMD::CompositeVisitor::addVisitor
                  (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
                   (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
      }
      else if (local_340 != (long *)0x0) {
        (**(code **)(*local_340 + 8))();
      }
    }
    if (((local_4c != 0) || (local_48 != 0)) || (local_44 != 0)) {
      OpenMD::Vector3<int>::Vector3
                ((Vector3<int> *)in_stack_fffffffffffff6f0,
                 (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),(int)in_stack_fffffffffffff6e8,
                 (int)((ulong)in_stack_fffffffffffff6e0 >> 0x20));
      pvVar4 = operator_new(0x58);
      OpenMD::Vector3<int>::Vector3
                ((Vector3<int> *)in_stack_fffffffffffff6e0,(Vector3<int> *)in_stack_fffffffffffff6d8
                );
      OpenMD::ReplicateVisitor::ReplicateVisitor
                ((ReplicateVisitor *)in_stack_fffffffffffff760,in_stack_fffffffffffff758,
                 in_stack_fffffffffffff750);
      local_358 = pvVar4;
      OpenMD::CompositeVisitor::addVisitor
                (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
                 (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
    }
    if ((local_50 == 0) || (local_54 == 0)) {
      if ((local_50 != 0) || (local_54 != 0)) {
        strcpy(painCave.errMsg,"The --refsele and --originsele arguments should appear together.\n")
        ;
        painCave.isFatal = 1;
        simError();
      }
    }
    else {
      operator_new(0xcd0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff720,in_stack_fffffffffffff718,in_stack_fffffffffffff710);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff720,in_stack_fffffffffffff718,in_stack_fffffffffffff710);
      OpenMD::LipidTransVisitor::LipidTransVisitor
                (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,
                 in_stack_fffffffffffff7a8);
      OpenMD::CompositeVisitor::addVisitor
                (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
                 (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
      std::__cxx11::string::~string(local_3b0);
      std::allocator<char>::~allocator(&local_3b1);
      std::__cxx11::string::~string(local_388);
      std::allocator<char>::~allocator(&local_389);
    }
    if (local_58 == 0) {
      local_3c0 = (XYZVisitor *)operator_new(0x668);
      OpenMD::XYZVisitor::XYZVisitor
                ((XYZVisitor *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
    }
    else {
      local_3c0 = (XYZVisitor *)operator_new(0x668);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff720,in_stack_fffffffffffff718,in_stack_fffffffffffff710);
      OpenMD::XYZVisitor::XYZVisitor
                (in_stack_fffffffffffff740,in_stack_fffffffffffff738,in_stack_fffffffffffff730);
      in_stack_fffffffffffffc1e = 0;
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffc20);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc1f);
    }
    if (local_e0 != 0) {
      local_269 = 1;
      OpenMD::XYZVisitor::doVelocities(local_3c0,true);
    }
    if (local_d0 != 0) {
      local_26a = 1;
      OpenMD::XYZVisitor::doForces(local_3c0,true);
    }
    if (local_c0 != 0) {
      local_26b = 1;
      OpenMD::XYZVisitor::doVectors(local_3c0,true);
    }
    if (local_b0 != 0) {
      local_26c = 1;
      OpenMD::XYZVisitor::doCharges(local_3c0,true);
    }
    if (local_a0 != 0) {
      local_26d = 1;
      OpenMD::XYZVisitor::doElectricFields(local_3c0,true);
    }
    if (local_90 != 0) {
      local_26e = 1;
      OpenMD::XYZVisitor::doGlobalIDs(local_3c0,true);
    }
    OpenMD::CompositeVisitor::addVisitor
              (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
               (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
    plVar3 = (long *)operator_new(0x28);
    OpenMD::PrepareVisitor::PrepareVisitor((PrepareVisitor *)in_stack_fffffffffffff6f0);
    pvVar4 = operator_new(0x1258);
    OpenMD::DumpReader::DumpReader
              (in_stack_fffffffffffff940,in_stack_fffffffffffff938,
               (string *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
    iVar2 = OpenMD::DumpReader::getNFrames(in_stack_fffffffffffff6e0);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(&stack0xfffffffffffffa00,pcVar5,_S_out);
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_608)
    ;
    __gnu_cxx::
    __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
    ::__normal_iterator(&local_610);
    __gnu_cxx::
    __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
    ::__normal_iterator(&local_618);
    OpenMD::Vector3<double>::Vector3((Vector3<double> *)0x127c03);
    OpenMD::Vector3<double>::Vector3((Vector3<double> *)0x127c12);
    OpenMD::Vector3<double>::Vector3((Vector3<double> *)0x127c21);
    OpenMD::SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x127c30);
    for (iVar6 = 0; iVar6 < iVar2; iVar6 = local_1e8 + iVar6) {
      OpenMD::DumpReader::readFrame
                (in_stack_fffffffffffff770,(int)((ulong)in_stack_fffffffffffff768 >> 0x20));
      if ((local_26a & 1) != 0) {
        (**(code **)(*local_2f8 + 0x10))();
      }
      if (local_1c0 != 0) {
        this_00 = OpenMD::SimInfo::getSnapshotManager(local_2f0);
        OpenMD::SnapshotManager::getCurrentSnapshot(this_00);
        local_620 = (Snapshot *)
                    OpenMD::SimInfo::beginMolecule
                              (in_stack_fffffffffffff700,
                               (MoleculeIterator *)in_stack_fffffffffffff6f8);
        while (local_620 != (Snapshot *)0x0) {
          OpenMD::Molecule::getCom((Molecule *)in_stack_fffffffffffff738);
          OpenMD::Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffff6e0,
                     (Vector3<double> *)in_stack_fffffffffffff6d8);
          OpenMD::Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffff6e0,
                     (Vector3<double> *)in_stack_fffffffffffff6d8);
          OpenMD::Snapshot::wrapVector
                    (in_stack_fffffffffffff760,(Vector3d *)in_stack_fffffffffffff758);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffff6e8,
                            (Vector<double,_3U> *)in_stack_fffffffffffff6e0);
          OpenMD::Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffff6e8,
                     (Vector<double,_3U> *)in_stack_fffffffffffff6e0);
          local_628 = (DumpReader *)
                      OpenMD::Molecule::beginIntegrableObject
                                ((Molecule *)in_stack_fffffffffffff700,
                                 (iterator *)in_stack_fffffffffffff6f8);
          while (local_628 != (DumpReader *)0x0) {
            OpenMD::StuntDouble::getPos((StuntDouble *)in_stack_fffffffffffff6e8);
            OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff6e8,
                              (Vector<double,_3U> *)in_stack_fffffffffffff6e0);
            OpenMD::Vector3<double>::Vector3
                      ((Vector3<double> *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
            OpenMD::StuntDouble::setPos
                      (in_stack_fffffffffffff6f0,(Vector3d *)in_stack_fffffffffffff6e8);
            in_stack_fffffffffffff770 =
                 (DumpReader *)
                 OpenMD::Molecule::nextIntegrableObject
                           ((Molecule *)in_stack_fffffffffffff700,
                            (iterator *)in_stack_fffffffffffff6f8);
            local_628 = in_stack_fffffffffffff770;
          }
          in_stack_fffffffffffff768 =
               (SimInfo *)
               OpenMD::SimInfo::nextMolecule
                         (in_stack_fffffffffffff700,(MoleculeIterator *)in_stack_fffffffffffff6f8);
          local_620 = (Snapshot *)in_stack_fffffffffffff768;
        }
      }
      in_stack_fffffffffffff760 =
           (Snapshot *)
           OpenMD::SimInfo::beginMolecule
                     (in_stack_fffffffffffff700,(MoleculeIterator *)in_stack_fffffffffffff6f8);
      local_620 = in_stack_fffffffffffff760;
      while (local_620 != (Snapshot *)0x0) {
        in_stack_fffffffffffff758 =
             (SimInfo *)
             OpenMD::Molecule::beginRigidBody
                       ((Molecule *)in_stack_fffffffffffff700,(iterator *)in_stack_fffffffffffff6f8)
        ;
        local_630 = in_stack_fffffffffffff758;
        while (local_630 != (SimInfo *)0x0) {
          OpenMD::RigidBody::updateAtoms(this);
          if ((local_269 & 1) != 0) {
            OpenMD::RigidBody::updateAtomVel(in_stack_fffffffffffffa00);
          }
          local_630 = (SimInfo *)
                      OpenMD::Molecule::nextRigidBody
                                ((Molecule *)in_stack_fffffffffffff700,
                                 (iterator *)in_stack_fffffffffffff6f8);
        }
        local_620 = (Snapshot *)
                    OpenMD::SimInfo::nextMolecule
                              (in_stack_fffffffffffff700,
                               (MoleculeIterator *)in_stack_fffffffffffff6f8);
      }
      local_620 = (Snapshot *)
                  OpenMD::SimInfo::beginMolecule
                            (in_stack_fffffffffffff700,(MoleculeIterator *)in_stack_fffffffffffff6f8
                            );
      while (local_620 != (Snapshot *)0x0) {
        in_stack_fffffffffffff738 =
             (SimInfo *)
             OpenMD::Molecule::beginIntegrableObject
                       ((Molecule *)in_stack_fffffffffffff700,(iterator *)in_stack_fffffffffffff6f8)
        ;
        local_628 = (DumpReader *)in_stack_fffffffffffff738;
        while (local_628 != (DumpReader *)0x0) {
          (**(_func_int **)((long)local_628->info_ + 0x48))(local_628,plVar3);
          local_628 = (DumpReader *)
                      OpenMD::Molecule::nextIntegrableObject
                                ((Molecule *)in_stack_fffffffffffff700,
                                 (iterator *)in_stack_fffffffffffff6f8);
        }
        local_620 = (Snapshot *)
                    OpenMD::SimInfo::nextMolecule
                              (in_stack_fffffffffffff700,
                               (MoleculeIterator *)in_stack_fffffffffffff6f8);
      }
      (**(code **)(*local_300 + 0x48))();
      local_620 = (Snapshot *)
                  OpenMD::SimInfo::beginMolecule
                            (in_stack_fffffffffffff700,(MoleculeIterator *)in_stack_fffffffffffff6f8
                            );
      while (local_620 != (Snapshot *)0x0) {
        local_628 = (DumpReader *)
                    OpenMD::Molecule::beginIntegrableObject
                              ((Molecule *)in_stack_fffffffffffff700,
                               (iterator *)in_stack_fffffffffffff6f8);
        while (local_628 != (DumpReader *)0x0) {
          (**(_func_int **)((long)local_628->info_ + 0x48))(local_628,local_300);
          local_628 = (DumpReader *)
                      OpenMD::Molecule::nextIntegrableObject
                                ((Molecule *)in_stack_fffffffffffff700,
                                 (iterator *)in_stack_fffffffffffff6f8);
        }
        local_620 = (Snapshot *)
                    OpenMD::SimInfo::nextMolecule
                              (in_stack_fffffffffffff700,
                               (MoleculeIterator *)in_stack_fffffffffffff6f8);
      }
      OpenMD::XYZVisitor::writeFrame
                (in_stack_fffffffffffffc20,
                 (ostream *)
                 CONCAT17(in_stack_fffffffffffffc1f,
                          CONCAT16(in_stack_fffffffffffffc1e,in_stack_fffffffffffffc18)));
      OpenMD::XYZVisitor::clear((XYZVisitor *)0x128254);
    }
    std::ofstream::close();
    if (local_2f8 != (long *)0x0) {
      (**(code **)(*local_2f8 + 8))();
    }
    if (local_300 != (long *)0x0) {
      (**(code **)(*local_300 + 8))();
    }
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
    }
    if (pvVar4 != (void *)0x0) {
      OpenMD::DumpReader::~DumpReader(in_stack_fffffffffffff6e0);
      operator_delete(pvVar4,0x1258);
    }
    if (local_2f0 != (SimInfo *)0x0) {
      (*local_2f0->_vptr_SimInfo[1])();
    }
    OpenMD::SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x128332);
    std::ofstream::~ofstream(&stack0xfffffffffffffa00);
    OpenMD::SimCreator::~SimCreator((SimCreator *)0x12834c);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_248);
    return local_4;
  }
  exit(1);
}

Assistant:

int main(int argc, char* argv[]) {
  gengetopt_args_info args_info;
  string dumpFileName;
  string xyzFileName;

  bool printVel(false);
  bool printFrc(false);
  bool printVec(false);
  bool printChrg(false);
  bool printField(false);
  bool printGlobalID(false);

  // parse the command line option
  if (cmdline_parser(argc, argv, &args_info) != 0) { exit(1); }

  // get the dumpfile name and meta-data file name
  if (args_info.input_given) {
    dumpFileName = args_info.input_arg;
  } else {
    strcpy(painCave.errMsg, "No input file name was specified.\n");
    painCave.isFatal = 1;
    simError();
  }

  if (args_info.output_given) {
    xyzFileName = args_info.output_arg;
  } else {
    xyzFileName = dumpFileName;
    xyzFileName = xyzFileName.substr(0, xyzFileName.rfind(".")) + ".xyz";
  }

  // parse md file and set up the system
  SimCreator creator;
  SimInfo* info          = creator.createSim(dumpFileName, false);
  ForceManager* forceMan = new ForceManager(info);

  // create visitor list
  CompositeVisitor* compositeVisitor = new CompositeVisitor();

  // create RigidBody Visitor
  if (args_info.rigidbody_flag) {
    RBCOMVisitor* rbCOMVisitor = new RBCOMVisitor(info);
    compositeVisitor->addVisitor(rbCOMVisitor, 900);
  }

  // create SSD atom visitor
  SSDAtomVisitor* ssdVisitor = new SSDAtomVisitor(info);
  compositeVisitor->addVisitor(ssdVisitor, 800);

  // create GBtail atom visitor
  GBtailVisitor* gbtVisitor = new GBtailVisitor(info);
  compositeVisitor->addVisitor(gbtVisitor, 790);

  // create GBhead atom visitor
  GBheadVisitor* gbhVisitor = new GBheadVisitor(info);
  compositeVisitor->addVisitor(gbhVisitor, 789);

  // create default atom visitor
  DefaultAtomVisitor* defaultAtomVisitor = new DefaultAtomVisitor(info);
  compositeVisitor->addVisitor(defaultAtomVisitor, 700);

  // if we gave the -w option, we want to skip the waters:
  if (!args_info.water_given) {
    // create waterType visitor
    if (args_info.watertype_flag) {
      WaterTypeVisitor* waterTypeVisitor = new WaterTypeVisitor;
      compositeVisitor->addVisitor(waterTypeVisitor, 600);
    }
  }

  if (args_info.basetype_flag) {
    AtomNameVisitor* atomNameVisitor = new AtomNameVisitor(info);
    compositeVisitor->addVisitor(atomNameVisitor, 550);
    // When debugging visitors, you may find this helpful:
    //    cout << compositeVisitor->toString();
  }

  // create ZconsVisitor
  if (args_info.zconstraint_flag) {
    ZConsVisitor* zconsVisitor = new ZConsVisitor(info);

    if (zconsVisitor->haveZconsMol()) {
      compositeVisitor->addVisitor(zconsVisitor, 500);
    } else {
      delete zconsVisitor;
    }
  }

  // create wrapping visitor

  // if(args_info.periodicBox_flag){
  //  WrappingVisitor* wrappingVisitor = new WrappingVisitor(info);
  //  compositeVisitor->addVisitor(wrappingVisitor, 400);
  //}

  // create replicate visitor
  if (args_info.repeatX_given > 0 || args_info.repeatY_given > 0 ||
      args_info.repeatZ_given > 0) {
    Vector3i replicateOpt(args_info.repeatX_arg, args_info.repeatY_arg,
                          args_info.repeatZ_arg);
    ReplicateVisitor* replicateVisitor =
        new ReplicateVisitor(info, replicateOpt);
    compositeVisitor->addVisitor(replicateVisitor, 300);
  }

  // create rotation visitor
  if (args_info.refsele_given && args_info.originsele_given) {
    compositeVisitor->addVisitor(
        new LipidTransVisitor(info, args_info.originsele_arg,
                              args_info.refsele_arg),
        250);
  } else if (args_info.refsele_given || args_info.originsele_given) {
    strcpy(
        painCave.errMsg,
        "The --refsele and --originsele arguments should appear together.\n");
    painCave.isFatal = 1;
    simError();
  }

  // create xyzVisitor
  XYZVisitor* xyzVisitor;

  if (args_info.selection_given) {
    xyzVisitor = new XYZVisitor(info, args_info.selection_arg);
  } else {
    xyzVisitor = new XYZVisitor(info);
  }

  if (args_info.velocities_flag) {
    printVel = true;
    xyzVisitor->doVelocities(printVel);
  }
  if (args_info.forces_flag) {
    printFrc = true;
    xyzVisitor->doForces(printFrc);
  }
  if (args_info.vectors_flag) {
    printVec = true;
    xyzVisitor->doVectors(printVec);
  }
  if (args_info.charges_flag) {
    printChrg = true;
    xyzVisitor->doCharges(printChrg);
  }
  if (args_info.efield_flag) {
    printField = true;
    xyzVisitor->doElectricFields(printField);
  }
  if (args_info.globalID_flag) {
    printGlobalID = true;
    xyzVisitor->doGlobalIDs(printGlobalID);
  }

  compositeVisitor->addVisitor(xyzVisitor, 200);

  // create prepareVisitor
  PrepareVisitor* prepareVisitor = new PrepareVisitor();

  // open dump file
  DumpReader* dumpReader = new DumpReader(info, dumpFileName);
  int nframes            = dumpReader->getNFrames();

  ofstream xyzStream(xyzFileName.c_str());

  SimInfo::MoleculeIterator miter;
  Molecule::IntegrableObjectIterator iiter;
  Molecule::RigidBodyIterator rbIter;
  Molecule* mol;
  StuntDouble* sd;
  RigidBody* rb;
  Vector3d molCom;
  Vector3d newMolCom;
  Vector3d displacement;
  Mat3x3d hmat;
  Snapshot* currentSnapshot;

  for (int i = 0; i < nframes; i += args_info.frame_arg) {
    dumpReader->readFrame(i);

    if (printFrc) forceMan->calcForces();

    // wrapping the molecule
    if (args_info.periodicBox_flag) {
      currentSnapshot = info->getSnapshotManager()->getCurrentSnapshot();
      for (mol = info->beginMolecule(miter); mol != NULL;
           mol = info->nextMolecule(miter)) {
        molCom    = mol->getCom();
        newMolCom = molCom;
        currentSnapshot->wrapVector(newMolCom);
        displacement = newMolCom - molCom;

        for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
             sd = mol->nextIntegrableObject(iiter)) {
          sd->setPos(sd->getPos() + displacement);
        }
      }
    }

    // update atoms of rigidbody
    for (mol = info->beginMolecule(miter); mol != NULL;
         mol = info->nextMolecule(miter)) {
      // change the positions of atoms which belong to the rigidbodies
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        rb->updateAtoms();
        if (printVel) rb->updateAtomVel();
      }
    }

    // prepare visit
    for (mol = info->beginMolecule(miter); mol != NULL;
         mol = info->nextMolecule(miter)) {
      for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
           sd = mol->nextIntegrableObject(iiter)) {
        sd->accept(prepareVisitor);
      }
    }

    // update visitor
    compositeVisitor->update();

    // visit stuntdouble
    for (mol = info->beginMolecule(miter); mol != NULL;
         mol = info->nextMolecule(miter)) {
      for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
           sd = mol->nextIntegrableObject(iiter)) {
        sd->accept(compositeVisitor);
      }
    }

    xyzVisitor->writeFrame(xyzStream);
    xyzVisitor->clear();

  }  // end for (int i = 0; i < nframes; i += args_info.frame_arg)

  xyzStream.close();

  delete forceMan;
  delete compositeVisitor;
  delete prepareVisitor;
  delete dumpReader;

  delete info;
}